

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_binary_func_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op)

{
  bool bVar1;
  bool forwarding;
  SPIRType *type;
  char *op_local;
  string local_90;
  string local_70;
  string local_50;
  
  op_local = op;
  type = Compiler::get_type(&this->super_Compiler,(TypeID)result_type);
  bVar1 = Compiler::type_is_opaque_value(&this->super_Compiler,type);
  forwarding = true;
  if (!bVar1) {
    bVar1 = should_forward(this,op0);
    if (bVar1) {
      forwarding = should_forward(this,op1);
    }
    else {
      forwarding = false;
    }
  }
  to_unpacked_expression_abi_cxx11_(&local_70,this,op0,true);
  to_unpacked_expression_abi_cxx11_(&local_90,this,op1,true);
  join<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
            (&local_50,(spirv_cross *)&op_local,(char **)0x39e911,(char (*) [2])&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39b375,
             (char (*) [3])&local_90,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a9fc7,
             (char (*) [2])CONCAT44(op0,result_type));
  emit_op(this,result_type,result_id,&local_50,forwarding,false);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
  return;
}

Assistant:

void CompilerGLSL::emit_binary_func_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                       const char *op)
{
	// Opaque types (e.g. OpTypeSampledImage) must always be forwarded in GLSL
	const auto &type = get_type(result_type);
	bool must_forward = type_is_opaque_value(type);
	bool forward = must_forward || (should_forward(op0) && should_forward(op1));
	emit_op(result_type, result_id, join(op, "(", to_unpacked_expression(op0), ", ", to_unpacked_expression(op1), ")"),
	        forward);
	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
}